

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void * __thiscall
Diligent::FixedBlockMemoryAllocator::AllocateAligned
          (FixedBlockMemoryAllocator *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  void *pvVar1;
  Char *extraout_RDX;
  Int32 dbgLineNumber_00;
  char (*Args_2) [34];
  string msg;
  char local_40 [8];
  string local_38;
  
  dbgLineNumber_00 = (Int32)dbgFileName;
  if (8 < Alignment) {
    Args_2 = (char (*) [34])local_40;
    local_40[0] = '\b';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    FormatString<char[12],unsigned_long,char[34],unsigned_long,char[2]>
              (&local_38,(Diligent *)"Alignment (",(char (*) [12])&stack0xffffffffffffffb8,
               (unsigned_long *)") exceeds the default alignment (",Args_2,(unsigned_long *)0x801c00
               ,(char (*) [2])Alignment);
    dbgLineNumber_00 = (Int32)Args_2;
    dbgDescription = (char *)0x108;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x108);
    std::__cxx11::string::~string((string *)&local_38);
    Alignment = (size_t)extraout_RDX;
  }
  pvVar1 = Allocate(this,Size,(Char *)Alignment,dbgDescription,dbgLineNumber_00);
  return pvVar1;
}

Assistant:

void* FixedBlockMemoryAllocator::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(Alignment <= sizeof(void*), "Alignment (", Alignment, ") exceeds the default alignment (", sizeof(void*), ")");
    return Allocate(Size, dbgDescription, dbgFileName, dbgLineNumber);
}